

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O1

bool vkt::sparse::checkSparseSupportForImageType
               (InstanceInterface *instance,VkPhysicalDevice physicalDevice,ImageType imageType)

{
  int iVar1;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkPhysicalDeviceFeatures local_ec;
  
  ::vk::getPhysicalDeviceFeatures(&local_ec,instance,physicalDevice);
  if (local_ec.sparseBinding != 0) {
    iVar1 = 3;
    if (imageType < IMAGE_TYPE_LAST) {
      iVar1 = *(int *)(&DAT_00b68518 + (ulong)imageType * 4);
    }
    if ((iVar1 == 2) ||
       (local_ec.sparseResidencyImage3D = local_ec.sparseResidencyImage2D, iVar1 == 1)) {
      return local_ec.sparseResidencyImage3D == 1;
    }
  }
  return false;
}

Assistant:

bool checkSparseSupportForImageType (const InstanceInterface&	instance,
									 const VkPhysicalDevice		physicalDevice,
									 const ImageType			imageType)
{
	const VkPhysicalDeviceFeatures deviceFeatures = getPhysicalDeviceFeatures(instance, physicalDevice);

	if (!deviceFeatures.sparseBinding)
		return false;

	switch (mapImageType(imageType))
	{
		case VK_IMAGE_TYPE_2D:
			return deviceFeatures.sparseResidencyImage2D == VK_TRUE;
		case VK_IMAGE_TYPE_3D:
			return deviceFeatures.sparseResidencyImage3D == VK_TRUE;
		default:
			DE_ASSERT(0);
			return false;
	};
}